

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O0

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessNode
          (MakeLeftHandedProcess *this,aiNode *pNode,aiMatrix4x4 *pParentGlobalRotation)

{
  aiNode *pNode_00;
  aiMatrix4x4t<float> local_68;
  ulong local_28;
  size_t a;
  aiMatrix4x4 *pParentGlobalRotation_local;
  aiNode *pNode_local;
  MakeLeftHandedProcess *this_local;
  
  (pNode->mTransformation).c1 = -(pNode->mTransformation).c1;
  (pNode->mTransformation).c2 = -(pNode->mTransformation).c2;
  (pNode->mTransformation).c3 = -(pNode->mTransformation).c3;
  (pNode->mTransformation).c4 = -(pNode->mTransformation).c4;
  (pNode->mTransformation).a3 = -(pNode->mTransformation).a3;
  (pNode->mTransformation).b3 = -(pNode->mTransformation).b3;
  (pNode->mTransformation).c3 = -(pNode->mTransformation).c3;
  (pNode->mTransformation).d3 = -(pNode->mTransformation).d3;
  a = (size_t)pParentGlobalRotation;
  pParentGlobalRotation_local = (aiMatrix4x4 *)pNode;
  pNode_local = (aiNode *)this;
  for (local_28 = 0; local_28 < (uint)pParentGlobalRotation_local[0x11].b1; local_28 = local_28 + 1)
  {
    pNode_00 = *(aiNode **)(*(long *)&pParentGlobalRotation_local[0x11].b3 + local_28 * 8);
    aiMatrix4x4t<float>::operator*
              (&local_68,(aiMatrix4x4t<float> *)a,
               (aiMatrix4x4t<float> *)&pParentGlobalRotation_local[0x10].a2);
    ProcessNode(this,pNode_00,&local_68);
  }
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessNode( aiNode* pNode, const aiMatrix4x4& pParentGlobalRotation)
{
    // mirror all base vectors at the local Z axis
    pNode->mTransformation.c1 = -pNode->mTransformation.c1;
    pNode->mTransformation.c2 = -pNode->mTransformation.c2;
    pNode->mTransformation.c3 = -pNode->mTransformation.c3;
    pNode->mTransformation.c4 = -pNode->mTransformation.c4;

    // now invert the Z axis again to keep the matrix determinant positive.
    // The local meshes will be inverted accordingly so that the result should look just fine again.
    pNode->mTransformation.a3 = -pNode->mTransformation.a3;
    pNode->mTransformation.b3 = -pNode->mTransformation.b3;
    pNode->mTransformation.c3 = -pNode->mTransformation.c3;
    pNode->mTransformation.d3 = -pNode->mTransformation.d3; // useless, but anyways...

    // continue for all children
    for( size_t a = 0; a < pNode->mNumChildren; ++a ) {
        ProcessNode( pNode->mChildren[ a ], pParentGlobalRotation * pNode->mTransformation );
    }
}